

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::checkValidTagNumber(DataDictionary *this,FieldBase *field)

{
  int field_00;
  const_iterator cVar1;
  InvalidTagNumber *this_00;
  allocator<char> local_41;
  string local_40;
  
  local_40._M_dataplus._M_p._0_4_ = field->m_tag;
  cVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_fields)._M_t,(key_type *)&local_40);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_fields)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  this_00 = (InvalidTagNumber *)__cxa_allocate_exception(0x58);
  field_00 = field->m_tag;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  InvalidTagNumber::InvalidTagNumber(this_00,field_00,&local_40);
  __cxa_throw(this_00,&InvalidTagNumber::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(InvalidTagNumber) {
    if (m_fields.find(field.getTag()) == m_fields.end()) {
      throw InvalidTagNumber(field.getTag());
    }
  }